

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

u8 mbc3_read_ext_ram(Emulator *e,MaskedAddress addr)

{
  byte local_29;
  u8 result;
  Mbc3 *mbc3;
  MaskedAddress addr_local;
  Emulator *e_local;
  
  if ((e->state).memory_map_state.ext_ram_enabled == FALSE) {
    e_local._7_1_ = 0xff;
  }
  else if ((e->state).memory_map_state.field_3.mbc3.rtc_reg < 4) {
    e_local._7_1_ = gb_read_ext_ram(e,addr);
  }
  else if ((e->state).memory_map_state.field_3.mbc3.latched == FALSE) {
    e_local._7_1_ = 0xff;
  }
  else {
    local_29 = 0xff;
    switch((e->state).memory_map_state.field_3.mbc3.rtc_reg) {
    case '\b':
      local_29 = (e->state).memory_map_state.field_3.mbc1.byte_2000_3fff;
      break;
    case '\t':
      local_29 = (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff;
      break;
    case '\n':
      local_29 = (e->state).memory_map_state.field_3.mbc3.hour;
      break;
    case '\v':
      local_29 = (byte)(e->state).memory_map_state.field_3.mbc3.day;
      break;
    case '\f':
      local_29 = (byte)(((e->state).memory_map_state.field_3.mbc3.day_carry & TRUE) << 7) |
                 (byte)(((e->state).memory_map_state.field_3.mbc3.rtc_halt & TRUE) << 6) |
                 (byte)((e->state).memory_map_state.field_3.mbc3.day >> 8) & 1;
    }
    e_local._7_1_ = local_29;
  }
  return e_local._7_1_;
}

Assistant:

static u8 mbc3_read_ext_ram(Emulator* e, MaskedAddress addr) {
  if (!MMAP_STATE.ext_ram_enabled) {
    return INVALID_READ_BYTE;
  }

  Mbc3* mbc3 = &MMAP_STATE.mbc3;
  if (mbc3->rtc_reg <= 3) {
    return gb_read_ext_ram(e, addr);
  }

  if (!mbc3->latched) {
    return INVALID_READ_BYTE;
  }

  u8 result = INVALID_READ_BYTE;
  switch (mbc3->rtc_reg) {
    case 8: result = mbc3->sec; break;
    case 9: result = mbc3->min; break;
    case 10: result = mbc3->hour; break;
    case 11: result = mbc3->day; break;
    case 12:
      result = PACK(mbc3->day_carry, MBC3_RTC_DAY_CARRY) |
               PACK(mbc3->rtc_halt, MBC3_RTC_HALT) |
               PACK((mbc3->day >> 8) & 1, MBC3_RTC_DAY_HI);
      break;
  }

  return result;
}